

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_ray_tracing.cpp
# Opt level: O0

bool dxil_spv::emit_allocate_ray_query(Impl *impl,CallInst *inst)

{
  SPIRVModule *this;
  Id type;
  mapped_type *pmVar1;
  Builder *local_30;
  Id local_24;
  Builder *pBStack_20;
  Id var_id;
  Builder *builder;
  CallInst *inst_local;
  Impl *impl_local;
  
  builder = (Builder *)inst;
  inst_local = (CallInst *)impl;
  pBStack_20 = Converter::Impl::builder(impl);
  this = (SPIRVModule *)(inst_local->super_Instruction).super_Value.tween_id;
  type = spv::Builder::makeRayQueryType(pBStack_20);
  local_24 = SPIRVModule::create_variable(this,StorageClassPrivate,type,(char *)0x0);
  Converter::Impl::rewrite_value((Impl *)inst_local,(Value *)builder,local_24);
  local_30 = builder;
  pmVar1 = std::
           unordered_map<const_LLVMBC::Value_*,_spv::StorageClass,_std::hash<const_LLVMBC::Value_*>,_std::equal_to<const_LLVMBC::Value_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_spv::StorageClass>_>_>
           ::operator[]((unordered_map<const_LLVMBC::Value_*,_spv::StorageClass,_std::hash<const_LLVMBC::Value_*>,_std::equal_to<const_LLVMBC::Value_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_spv::StorageClass>_>_>
                         *)&inst_local[0x11].super_Instruction.is_terminator,(key_type *)&local_30);
  *pmVar1 = StorageClassPrivate;
  emit_ray_query_capabilities((Impl *)inst_local);
  return true;
}

Assistant:

bool emit_allocate_ray_query(Converter::Impl &impl, const llvm::CallInst *inst)
{
	// TODO: It seems like we can use full variable pointers with RayQuery in DXIL.
	// To implement this, we will need some kind of global "bank" of ray query objects,
	// and allocateRayQuery could assign indices into that global array.
	// Until we actually see this happen in practice, we can just allocate RayQuery objects like this.
	// The return type of allocateRayQuery appears to be i32, so this might be how it's intended to be done ...
	auto &builder = impl.builder();
	spv::Id var_id = impl.spirv_module.create_variable(spv::StorageClassPrivate, builder.makeRayQueryType());
	impl.rewrite_value(inst, var_id);
	impl.handle_to_storage_class[inst] = spv::StorageClassPrivate;
	emit_ray_query_capabilities(impl);
	return true;
}